

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O2

Result __thiscall
wabt::anon_unknown_15::BinaryReaderIR::OnImportGlobal
          (BinaryReaderIR *this,Index import_index,string_view module_name,string_view field_name,
          Index global_index,Type type,bool mutable_)

{
  anon_struct_3_3_4b311855_for_features_used *paVar1;
  bool *pbVar2;
  Module *pMVar3;
  __uniq_ptr_impl<wabt::GlobalImport,_std::default_delete<wabt::GlobalImport>_> local_80;
  undefined1 local_78 [32];
  char *local_58;
  Location local_50;
  
  local_78._16_8_ = field_name._M_str;
  local_78._8_8_ = field_name._M_len;
  local_58 = module_name._M_str;
  local_78._24_8_ = module_name._M_len;
  std::make_unique<wabt::GlobalImport>();
  std::__cxx11::string::assign<std::basic_string_view<char,std::char_traits<char>>>
            ((string *)(local_78._0_8_ + 8),
             (basic_string_view<char,_std::char_traits<char>_> *)(local_78 + 0x18));
  std::__cxx11::string::assign<std::basic_string_view<char,std::char_traits<char>>>
            ((string *)(local_78._0_8_ + 0x28),
             (basic_string_view<char,_std::char_traits<char>_> *)(local_78 + 8));
  *(Type *)(local_78._0_8_ + 0x70) = type;
  *(bool *)(local_78._0_8_ + 0x78) = mutable_;
  pMVar3 = this->module_;
  GetLocation(&local_50,this);
  std::
  make_unique<wabt::ImportModuleField,std::unique_ptr<wabt::GlobalImport,std::default_delete<wabt::GlobalImport>>,wabt::Location>
            ((unique_ptr<wabt::GlobalImport,_std::default_delete<wabt::GlobalImport>_> *)&local_80,
             (Location *)local_78);
  Module::AppendField(pMVar3,(unique_ptr<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_>
                              *)&local_80);
  if (local_80._M_t.
      super__Tuple_impl<0UL,_wabt::GlobalImport_*,_std::default_delete<wabt::GlobalImport>_>.
      super__Head_base<0UL,_wabt::GlobalImport_*,_false>._M_head_impl !=
      (_Tuple_impl<0UL,_wabt::GlobalImport_*,_std::default_delete<wabt::GlobalImport>_>)0x0) {
    (**(code **)(*(long *)local_80._M_t.
                          super__Tuple_impl<0UL,_wabt::GlobalImport_*,_std::default_delete<wabt::GlobalImport>_>
                          .super__Head_base<0UL,_wabt::GlobalImport_*,_false>._M_head_impl + 8))();
  }
  local_80._M_t.
  super__Tuple_impl<0UL,_wabt::GlobalImport_*,_std::default_delete<wabt::GlobalImport>_>.
  super__Head_base<0UL,_wabt::GlobalImport_*,_false>._M_head_impl =
       (tuple<wabt::GlobalImport_*,_std::default_delete<wabt::GlobalImport>_>)
       (_Tuple_impl<0UL,_wabt::GlobalImport_*,_std::default_delete<wabt::GlobalImport>_>)0x0;
  pMVar3 = this->module_;
  paVar1 = &pMVar3->features_used;
  paVar1->simd = (bool)(paVar1->simd | type.enum_ == V128);
  pbVar2 = &(pMVar3->features_used).exceptions;
  *pbVar2 = (bool)(*pbVar2 | type.enum_ == ExnRef);
  if ((long *)local_78._0_8_ != (long *)0x0) {
    (**(code **)(*(long *)local_78._0_8_ + 8))();
  }
  return (Result)Ok;
}

Assistant:

Result BinaryReaderIR::OnImportGlobal(Index import_index,
                                      std::string_view module_name,
                                      std::string_view field_name,
                                      Index global_index,
                                      Type type,
                                      bool mutable_) {
  auto import = std::make_unique<GlobalImport>();
  import->module_name = module_name;
  import->field_name = field_name;
  import->global.type = type;
  import->global.mutable_ = mutable_;
  module_->AppendField(
      std::make_unique<ImportModuleField>(std::move(import), GetLocation()));
  module_->features_used.simd |= (type == Type::V128);
  module_->features_used.exceptions |= (type == Type::ExnRef);
  return Result::Ok;
}